

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddPositionIndependentFlags
          (cmLocalGenerator *this,string *flags,string *lang,int targetType)

{
  size_type sVar1;
  string *o;
  _Alloc_hider _Var2;
  string flagsVar;
  string picFlags;
  allocator<char> local_69;
  string local_68;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  if (targetType == 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"CMAKE_",&local_69);
    std::__cxx11::string::append((string *)&local_68);
    std::__cxx11::string::append((char *)&local_68);
    cmMakefile::GetSafeDefinition(this->Makefile,&local_68);
    std::__cxx11::string::_M_assign((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_68);
    if (local_40._M_string_length == 0) goto LAB_001d8c61;
  }
  else {
LAB_001d8c61:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"CMAKE_",&local_69);
    std::__cxx11::string::append((string *)&local_68);
    std::__cxx11::string::append((char *)&local_68);
    cmMakefile::GetSafeDefinition(this->Makefile,&local_68);
    std::__cxx11::string::_M_assign((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_68);
    if (local_40._M_string_length == 0) goto LAB_001d8d76;
  }
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity = 0;
  cmSystemTools::ExpandListArgument
            (&local_40,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68,false);
  sVar1 = local_68._M_string_length;
  for (_Var2._M_p = local_68._M_dataplus._M_p; _Var2._M_p != (pointer)sVar1;
      _Var2._M_p = _Var2._M_p + 0x20) {
    (*this->_vptr_cmLocalGenerator[8])(this,flags,_Var2._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
LAB_001d8d76:
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmLocalGenerator::AddPositionIndependentFlags(std::string& flags,
                                                   std::string const& lang,
                                                   int targetType)
{
  std::string picFlags;

  if (targetType == cmStateEnums::EXECUTABLE) {
    std::string flagsVar = "CMAKE_";
    flagsVar += lang;
    flagsVar += "_COMPILE_OPTIONS_PIE";
    picFlags = this->Makefile->GetSafeDefinition(flagsVar);
  }
  if (picFlags.empty()) {
    std::string flagsVar = "CMAKE_";
    flagsVar += lang;
    flagsVar += "_COMPILE_OPTIONS_PIC";
    picFlags = this->Makefile->GetSafeDefinition(flagsVar);
  }
  if (!picFlags.empty()) {
    std::vector<std::string> options;
    cmSystemTools::ExpandListArgument(picFlags, options);
    for (std::string const& o : options) {
      this->AppendFlagEscape(flags, o);
    }
  }
}